

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void ge_equals_gej(secp256k1_ge *a,secp256k1_gej *b)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe u2;
  secp256k1_fe z2s;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_60;
  
  if (a->infinity == b->infinity) {
    if (a->infinity != 0) {
      return;
    }
    secp256k1_fe_sqr(&local_60,&b->z);
    secp256k1_fe_mul(&local_c8,&a->x,&local_60);
    local_98.n[0] = (b->x).n[0];
    local_98.n[1] = (b->x).n[1];
    local_98.n[2] = (b->x).n[2];
    local_98.n[3] = (b->x).n[3];
    local_98.n[4] = (b->x).n[4];
    local_98.magnitude = (b->x).magnitude;
    local_98.normalized = (b->x).normalized;
    secp256k1_fe_normalize_weak(&local_98);
    secp256k1_fe_mul(&local_f8,&a->y,&local_60);
    secp256k1_fe_mul(&local_f8,&local_f8,&b->z);
    local_128.n[0] = (b->y).n[0];
    local_128.n[1] = (b->y).n[1];
    local_128.n[2] = (b->y).n[2];
    local_128.n[3] = (b->y).n[3];
    local_128.n[4] = (b->y).n[4];
    local_128.magnitude = (b->y).magnitude;
    local_128.normalized = (b->y).normalized;
    secp256k1_fe_normalize_weak(&local_128);
    iVar1 = secp256k1_fe_equal_var(&local_c8,&local_98);
    if (iVar1 == 0) {
      pcVar3 = "test condition failed: secp256k1_fe_equal_var(&u1, &u2)";
      uVar2 = 0xec6;
    }
    else {
      iVar1 = secp256k1_fe_equal_var(&local_f8,&local_128);
      if (iVar1 != 0) {
        return;
      }
      pcVar3 = "test condition failed: secp256k1_fe_equal_var(&s1, &s2)";
      uVar2 = 0xec7;
    }
  }
  else {
    pcVar3 = "test condition failed: a->infinity == b->infinity";
    uVar2 = 0xebc;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void ge_equals_gej(const secp256k1_ge *a, const secp256k1_gej *b) {
    secp256k1_fe z2s;
    secp256k1_fe u1, u2, s1, s2;
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    /* Check a.x * b.z^2 == b.x && a.y * b.z^3 == b.y, to avoid inverses. */
    secp256k1_fe_sqr(&z2s, &b->z);
    secp256k1_fe_mul(&u1, &a->x, &z2s);
    u2 = b->x; secp256k1_fe_normalize_weak(&u2);
    secp256k1_fe_mul(&s1, &a->y, &z2s); secp256k1_fe_mul(&s1, &s1, &b->z);
    s2 = b->y; secp256k1_fe_normalize_weak(&s2);
    CHECK(secp256k1_fe_equal_var(&u1, &u2));
    CHECK(secp256k1_fe_equal_var(&s1, &s2));
}